

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O2

bool woff2::ReadTrueTypeFont(Buffer *file,uint8_t *data,size_t len,Font *font)

{
  ushort uVar1;
  _Rb_tree_color _Var2;
  uint32_t uVar3;
  bool bVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  mapped_type *this;
  _Base_ptr p_Var7;
  Table *pTVar8;
  _Rb_tree_color _Var9;
  ushort uVar10;
  Table local_a0;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  intervals;
  
  bVar4 = Buffer::ReadU16(file,&font->num_tables);
  if ((!bVar4) || (bVar4 = Buffer::Skip(file,6), !bVar4)) {
    return false;
  }
  intervals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &intervals._M_t._M_impl.super__Rb_tree_header._M_header;
  intervals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  intervals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  intervals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  intervals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       intervals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar10 = 0; uVar1 = font->num_tables, uVar10 < uVar1; uVar10 = uVar10 + 1) {
    local_a0.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0.reuse_of = (Table *)0x0;
    local_a0.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.flag_byte = '\0';
    bVar4 = Buffer::ReadU32(file,&local_a0.tag);
    if (((((!bVar4) || (bVar4 = Buffer::ReadU32(file,&local_a0.checksum), !bVar4)) ||
         (bVar4 = Buffer::ReadU32(file,&local_a0.offset), !bVar4)) ||
        ((bVar4 = Buffer::ReadU32(file,&local_a0.length), uVar3 = local_a0.length, !bVar4 ||
         ((local_a0.offset & 3) != 0)))) ||
       ((len < local_a0.length || (len - local_a0.length < (ulong)local_a0.offset)))) {
LAB_0010a2ac:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&local_a0.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
      ;
      goto LAB_0010a2b4;
    }
    pmVar5 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&intervals,&local_a0.offset);
    *pmVar5 = uVar3;
    local_a0.data = data + local_a0.offset;
    iVar6 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_woff2::Font::Table>,_std::_Select1st<std::pair<const_unsigned_int,_woff2::Font::Table>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
            ::find(&(font->tables)._M_t,&local_a0.tag);
    if ((_Rb_tree_header *)iVar6._M_node != &(font->tables)._M_t._M_impl.super__Rb_tree_header)
    goto LAB_0010a2ac;
    this = std::
           map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
           ::operator[](&font->tables,&local_a0.tag);
    Font::Table::operator=(this,&local_a0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_a0.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  _Var9 = (uint)uVar1 << 4 | 0xc;
  for (p_Var7 = intervals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &intervals._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    _Var2 = p_Var7[1]._M_color;
    if ((_Var2 < _Var9) ||
       (_Var9 = _Var2 + *(int *)&p_Var7[1].field_0x4, CARRY4(_Var2,*(uint *)&p_Var7[1].field_0x4)))
    goto LAB_0010a2b4;
  }
  pTVar8 = Font::FindTable(font,0x68656164);
  if ((pTVar8 == (Table *)0x0) || (0x33 < pTVar8->length)) {
    bVar4 = true;
  }
  else {
LAB_0010a2b4:
    bVar4 = false;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&intervals._M_t);
  return bVar4;
}

Assistant:

bool ReadTrueTypeFont(Buffer* file, const uint8_t* data, size_t len,
                      Font* font) {
  // We don't care about the search_range, entry_selector and range_shift
  // fields, they will always be computed upon writing the font.
  if (!file->ReadU16(&font->num_tables) ||
      !file->Skip(6)) {
    return FONT_COMPRESSION_FAILURE();
  }

  std::map<uint32_t, uint32_t> intervals;
  for (uint16_t i = 0; i < font->num_tables; ++i) {
    Font::Table table;
    table.flag_byte = 0;
    table.reuse_of = NULL;
    if (!file->ReadU32(&table.tag) ||
        !file->ReadU32(&table.checksum) ||
        !file->ReadU32(&table.offset) ||
        !file->ReadU32(&table.length)) {
      return FONT_COMPRESSION_FAILURE();
    }
    if ((table.offset & 3) != 0 ||
        table.length > len ||
        len - table.length < table.offset) {
      return FONT_COMPRESSION_FAILURE();
    }
    intervals[table.offset] = table.length;
    table.data = data + table.offset;
    if (font->tables.find(table.tag) != font->tables.end()) {
      return FONT_COMPRESSION_FAILURE();
    }
    font->tables[table.tag] = table;
  }

  // Check that tables are non-overlapping.
  uint32_t last_offset = 12UL + 16UL * font->num_tables;
  for (const auto& i : intervals) {
    if (i.first < last_offset || i.first + i.second < i.first) {
      return FONT_COMPRESSION_FAILURE();
    }
    last_offset = i.first + i.second;
  }

  // Sanity check key tables
  const Font::Table* head_table = font->FindTable(kHeadTableTag);
  if (head_table != NULL && head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }

  return true;
}